

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

void __thiscall
t_java_generator::print_const_value
          (t_java_generator *this,ostream *out,string *name,t_type *type,t_const_value *value,
          bool in_static,bool defval)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  size_t __n;
  t_type *type_00;
  pointer pptVar6;
  pointer pptVar7;
  int iVar8;
  t_type *ptVar9;
  ostream *poVar10;
  ulong uVar11;
  ostream *poVar12;
  t_const_value *ptVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  undefined4 extraout_var;
  long *plVar15;
  undefined4 extraout_var_00;
  size_type *psVar16;
  long lVar17;
  char cVar18;
  pointer pptVar19;
  char *pcVar20;
  undefined7 in_register_00000089;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  bool bVar22;
  string v2;
  string cap_name;
  string val_1;
  vector<t_field_*,_std::allocator<t_field_*>_> fields;
  string local_f0;
  undefined4 local_cc;
  t_const_value *local_c8;
  string *local_c0;
  ostream *local_b8;
  string local_b0;
  t_type *local_90;
  string local_88;
  vector<t_field_*,_std::allocator<t_field_*>_> local_68;
  string local_50;
  
  local_c8 = value;
  local_c0 = name;
  ptVar9 = t_type::get_true_type(type);
  t_generator::indent((t_generator *)this,out);
  if (!defval) {
    pcVar20 = "public static final ";
    if (in_static) {
      pcVar20 = "";
    }
    lVar17 = 0x14;
    if (in_static) {
      lVar17 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar20,lVar17);
    type_name_abi_cxx11_(&local_f0,this,ptVar9,false,false,false,false);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (out,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  iVar8 = (*(ptVar9->super_t_doc)._vptr_t_doc[5])(ptVar9);
  if ((char)iVar8 == '\0') {
    iVar8 = (*(ptVar9->super_t_doc)._vptr_t_doc[10])(ptVar9);
    if ((char)iVar8 == '\0') {
      iVar8 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xb])(ptVar9);
      local_cc = (undefined4)CONCAT71(in_register_00000089,in_static);
      local_b8 = out;
      if (((char)iVar8 != '\0') ||
         (iVar8 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xc])(ptVar9), (char)iVar8 != '\0')) {
        local_90 = ptVar9;
        std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
                  (&local_68,(vector<t_field_*,_std::allocator<t_field_*>_> *)(ptVar9 + 1));
        pptVar7 = local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pptVar6 = local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar11 = (long)local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          lVar17 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar17 == 0; lVar17 = lVar17 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<t_field**,std::vector<t_field*,std::allocator<t_field*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<t_field::key_compare>>
                    (local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<t_field**,std::vector<t_field*,std::allocator<t_field*>>>,__gnu_cxx::__ops::_Iter_comp_iter<t_field::key_compare>>
                    (pptVar6,pptVar7);
        }
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (out,(local_c0->_M_dataplus)._M_p,local_c0->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," = new ",7);
        type_name_abi_cxx11_(&local_f0,this,local_90,false,true,false,false);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"();",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        paVar2 = &local_f0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != paVar2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (!in_static) {
          poVar10 = t_generator::indent((t_generator *)this,local_b8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"static {",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
        }
        ptVar13 = (t_const_value *)
                  (local_c8->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_c8 = (t_const_value *)&(local_c8->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        if (ptVar13 != local_c8) {
          do {
            if (local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              ptVar9 = (t_type *)0x0;
            }
            else {
              ptVar9 = (t_type *)0x0;
              paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                           _M_impl.super__Vector_impl_data._M_start;
              do {
                sVar3 = paVar21->_M_allocated_capacity;
                p_Var4 = (ptVar13->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                p_Var5 = p_Var4[2]._M_parent;
                local_f0._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_f0,p_Var5,
                           (long)&(p_Var4[2]._M_left)->_M_color + (long)p_Var5);
                __n = *(size_t *)(sVar3 + 0x70);
                if (__n == local_f0._M_string_length) {
                  if (__n == 0) {
                    bVar22 = true;
                  }
                  else {
                    iVar8 = bcmp(*(void **)(sVar3 + 0x68),local_f0._M_dataplus._M_p,__n);
                    bVar22 = iVar8 == 0;
                  }
                }
                else {
                  bVar22 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != paVar2) {
                  operator_delete(local_f0._M_dataplus._M_p);
                }
                if (bVar22) {
                  ptVar9 = *(t_type **)(paVar21->_M_allocated_capacity + 0x60);
                }
                paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(&paVar21->_M_allocated_capacity + 1);
              } while (paVar21 !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
                          .super__Vector_impl_data._M_finish);
            }
            poVar10 = local_b8;
            if (ptVar9 == (t_type *)0x0) {
              pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar8 = (*(local_90->super_t_doc)._vptr_t_doc[3])();
              std::operator+(&local_b0,"type error: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var,iVar8));
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_b0);
              local_f0._M_dataplus._M_p = (pointer)*plVar15;
              psVar16 = (size_type *)(plVar15 + 2);
              if ((size_type *)local_f0._M_dataplus._M_p == psVar16) {
                local_f0.field_2._M_allocated_capacity = *psVar16;
                local_f0.field_2._8_4_ = (undefined4)plVar15[3];
                local_f0.field_2._12_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
                local_f0._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_f0.field_2._M_allocated_capacity = *psVar16;
              }
              local_f0._M_string_length = plVar15[1];
              *plVar15 = (long)psVar16;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              p_Var4 = (ptVar13->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
              p_Var5 = p_Var4[2]._M_parent;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_88,p_Var5,
                         (long)&(p_Var4[2]._M_left)->_M_color + (long)p_Var5);
              std::operator+(pbVar14,&local_f0,&local_88);
              __cxa_throw(pbVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            render_const_value_abi_cxx11_
                      (&local_f0,this,local_b8,ptVar9,
                       (t_const_value *)
                       (ptVar13->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
            poVar12 = t_generator::indent((t_generator *)this,poVar10);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(local_c0->_M_dataplus)._M_p,local_c0->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,".",1);
            p_Var4 = (ptVar13->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            p_Var5 = p_Var4[2]._M_parent;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,p_Var5,
                       (long)&(p_Var4[2]._M_left)->_M_color + (long)p_Var5);
            get_cap_name(&local_b0,this,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"set",3);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_b0._M_dataplus._M_p,local_b0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != paVar2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            ptVar13 = (t_const_value *)std::_Rb_tree_increment((_Rb_tree_node_base *)ptVar13);
          } while (ptVar13 != local_c8);
        }
        if ((char)local_cc == '\0') {
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar10 = t_generator::indent((t_generator *)this,local_b8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_b8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_start ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          return;
        }
        goto LAB_0024616d;
      }
      iVar8 = (*(ptVar9->super_t_doc)._vptr_t_doc[0x10])(ptVar9);
      if ((char)iVar8 == '\0') {
        iVar8 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xe])(ptVar9);
        if (((char)iVar8 == '\0') &&
           (iVar8 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xf])(ptVar9), (char)iVar8 == '\0')) {
          pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x20);
          iVar8 = (*(ptVar9->super_t_doc)._vptr_t_doc[3])(ptVar9);
          std::operator+(pbVar14,"compiler error: no const of type ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var_00,iVar8));
          __cxa_throw(pbVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        bVar22 = is_enum_set(this,ptVar9);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (out,(local_c0->_M_dataplus)._M_p,local_c0->_M_string_length);
        if (bVar22) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
          type_name_abi_cxx11_(&local_f0,this,ptVar9,false,true,true,false);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
          cVar18 = (char)local_cc;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,".noneOf(",8);
          inner_enum_type_name_abi_cxx11_(&local_b0,this,ptVar9);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_b0._M_dataplus._M_p,local_b0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," = new ",7);
          type_name_abi_cxx11_(&local_f0,this,ptVar9,false,true,false,false);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
          cVar18 = (char)local_cc;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"();",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (cVar18 == '\0') {
          poVar10 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"static {",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
        }
        (*(ptVar9->super_t_doc)._vptr_t_doc[0xe])(ptVar9);
        pptVar19 = (local_c8->listVal_).
                   super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (pptVar19 !=
            (local_c8->listVal_).
            super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          ptVar9 = *(t_type **)&ptVar9[1].super_t_doc.has_doc_;
          do {
            render_const_value_abi_cxx11_(&local_f0,this,out,ptVar9,*pptVar19);
            poVar10 = t_generator::indent((t_generator *)this,out);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(local_c0->_M_dataplus)._M_p,local_c0->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,".add(",5);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            pptVar19 = pptVar19 + 1;
          } while (pptVar19 !=
                   (local_c8->listVal_).
                   super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        if ((char)local_cc == '\0') {
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar10 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
          out = local_b8;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        return;
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      local_f0._M_string_length = 0;
      local_f0.field_2._M_allocated_capacity =
           local_f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar22 = is_enum_map(this,ptVar9);
      if (bVar22) {
        inner_enum_type_name_abi_cxx11_(&local_b0,this,ptVar9);
        std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (out,(local_c0->_M_dataplus)._M_p,local_c0->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," = new ",7);
      type_name_abi_cxx11_(&local_b0,this,ptVar9,false,true,false,false);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (!in_static) {
        poVar10 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"static {",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
      }
      ptVar13 = (t_const_value *)
                (local_c8->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_c8 = (t_const_value *)&(local_c8->mapVal_)._M_t._M_impl.super__Rb_tree_header;
      if (ptVar13 != local_c8) {
        type_00 = *(t_type **)&ptVar9[1].super_t_doc.has_doc_;
        ptVar9 = *(t_type **)&ptVar9[1].annotations_._M_t._M_impl;
        do {
          render_const_value_abi_cxx11_
                    (&local_b0,this,out,type_00,
                     (t_const_value *)
                     (ptVar13->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
          render_const_value_abi_cxx11_
                    (&local_88,this,out,ptVar9,
                     (t_const_value *)
                     (ptVar13->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
          poVar10 = t_generator::indent((t_generator *)this,out);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(local_c0->_M_dataplus)._M_p,local_c0->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,".put(",5);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_b0._M_dataplus._M_p,local_b0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_88._M_dataplus._M_p,local_88._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          ptVar13 = (t_const_value *)std::_Rb_tree_increment((_Rb_tree_node_base *)ptVar13);
        } while (ptVar13 != local_c8);
      }
      if ((char)local_cc == '\0') {
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar10 = t_generator::indent((t_generator *)this,local_b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (local_b8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    else {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (out,(local_c0->_M_dataplus)._M_p,local_c0->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
      render_const_value_abi_cxx11_(&local_f0,this,out,ptVar9,local_c8);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  else {
    render_const_value_abi_cxx11_(&local_f0,this,out,ptVar9,local_c8);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (out,(local_c0->_M_dataplus)._M_p,local_c0->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_f0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
    return;
  }
LAB_0024616d:
  operator_delete(local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return;
}

Assistant:

void t_java_generator::print_const_value(std::ostream& out,
                                         string name,
                                         t_type* type,
                                         t_const_value* value,
                                         bool in_static,
                                         bool defval) {
  type = get_true_type(type);

  indent(out);
  if (!defval) {
    out << (in_static ? "" : "public static final ") << type_name(type) << " ";
  }
  if (type->is_base_type()) {
    string v2 = render_const_value(out, type, value);
    out << name << " = " << v2 << ";" << endl << endl;
  } else if (type->is_enum()) {
    out << name << " = " << render_const_value(out, type, value) << ";" << endl << endl;
  } else if (type->is_struct() || type->is_xception()) {
    const vector<t_field*>& unsorted_fields = ((t_struct*)type)->get_members();
    vector<t_field*> fields = unsorted_fields;
    std::sort(fields.begin(), fields.end(), t_field::key_compare());
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    out << name << " = new " << type_name(type, false, true) << "();" << endl;
    if (!in_static) {
      indent(out) << "static {" << endl;
      indent_up();
    }
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      string val = render_const_value(out, field_type, v_iter->second);
      indent(out) << name << ".";
      std::string cap_name = get_cap_name(v_iter->first->get_string());
      out << "set" << cap_name << "(" << val << ");" << endl;
    }
    if (!in_static) {
      indent_down();
      indent(out) << "}" << endl;
    }
    out << endl;
  } else if (type->is_map()) {
    std::string constructor_args;
    if (is_enum_map(type)) {
      constructor_args = inner_enum_type_name(type);
    }
    out << name << " = new " << type_name(type, false, true) << "(" << constructor_args << ");" << endl;
    if (!in_static) {
      indent(out) << "static {" << endl;
      indent_up();
    }
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string key = render_const_value(out, ktype, v_iter->first);
      string val = render_const_value(out, vtype, v_iter->second);
      indent(out) << name << ".put(" << key << ", " << val << ");" << endl;
    }
    if (!in_static) {
      indent_down();
      indent(out) << "}" << endl;
    }
    out << endl;
  } else if (type->is_list() || type->is_set()) {
    if (is_enum_set(type)) {
      out << name << " = " << type_name(type, false, true, true) << ".noneOf(" << inner_enum_type_name(type) << ");" << endl;
    } else {
      out << name << " = new " << type_name(type, false, true) << "();" << endl;
    }
    if (!in_static) {
      indent(out) << "static {" << endl;
      indent_up();
    }
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, etype, *v_iter);
      indent(out) << name << ".add(" << val << ");" << endl;
    }
    if (!in_static) {
      indent_down();
      indent(out) << "}" << endl;
    }
    out << endl;
  } else {
    throw "compiler error: no const of type " + type->get_name();
  }
}